

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O0

int pageant_add_keyfile(Filename *filename,char *passphrase,char **retstr,_Bool add_encrypted)

{
  BinarySink *bs;
  _Bool _Var1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  LoadedFile *lf_00;
  PageantClientOp *pPVar5;
  char *pcVar6;
  size_t n;
  ptrlen pl;
  char **local_f0;
  uint reply_2;
  PageantClientOp *pco_2;
  uint reply_1;
  PageantClientOp *pco_1;
  char *pp_copy;
  uint reply;
  PageantClientOp *pco;
  LoadedFile *lf;
  char *load_error;
  undefined1 auStack_98 [6];
  _Bool have_encrypted;
  _Bool have_unencrypted;
  ulong local_88;
  size_t i;
  KeyList *kl;
  strbuf *blob;
  char *pcStack_68;
  int type;
  char *error;
  char *this_passphrase;
  char *comment;
  uint local_48;
  int attempts;
  int ret;
  _Bool needs_pass;
  ssh2_userkey *skey;
  RSAKey *rkey;
  char **ppcStack_28;
  _Bool add_encrypted_local;
  char **retstr_local;
  char *passphrase_local;
  Filename *filename_local;
  
  skey = (ssh2_userkey *)0x0;
  _ret = (ssh2_userkey *)0x0;
  pcStack_68 = (char *)0x0;
  rkey._7_1_ = add_encrypted;
  ppcStack_28 = retstr;
  retstr_local = (char **)passphrase;
  passphrase_local = (char *)filename;
  if (passphrases == (tree234 *)0x0) {
    passphrases = newtree234((cmpfn234)0x0);
  }
  *ppcStack_28 = (char *)0x0;
  blob._4_4_ = key_type((Filename *)passphrase_local);
  if ((blob._4_4_ == 2) || (blob._4_4_ == 3)) {
    if (((rkey._7_1_ & 1) == 0) || (blob._4_4_ != 2)) {
      kl = (KeyList *)strbuf_new();
      if (blob._4_4_ == 2) {
        iVar2 = rsa1_loadpub_f((Filename *)passphrase_local,((strbuf *)kl)->binarysink_,(char **)0x0
                               ,&stack0xffffffffffffff98);
        if (iVar2 == 0) {
          pcVar4 = dupprintf("Couldn\'t load private key (%s)",pcStack_68);
          *ppcStack_28 = pcVar4;
          strbuf_free((strbuf *)kl);
          return 1;
        }
        i = (size_t)pageant_get_keylist(1);
      }
      else {
        _Var1 = ppk_loadpub_f((Filename *)passphrase_local,(char **)0x0,((strbuf *)kl)->binarysink_,
                              (char **)0x0,&stack0xffffffffffffff98);
        if (!_Var1) {
          pcVar4 = dupprintf("Couldn\'t load private key (%s)",pcStack_68);
          *ppcStack_28 = pcVar4;
          strbuf_free((strbuf *)kl);
          return 1;
        }
        i = (size_t)pageant_get_keylist(2);
      }
      if (i != 0) {
        if ((*(byte *)(i + 0x18) & 1) != 0) {
          pcVar4 = dupstr("Received broken key list from agent");
          *ppcStack_28 = pcVar4;
          keylist_free((KeyList *)i);
          strbuf_free((strbuf *)kl);
          return 1;
        }
        for (local_88 = 0; local_88 < *(ulong *)(i + 0x10); local_88 = local_88 + 1) {
          _auStack_98 = ptrlen_from_strbuf((strbuf *)kl);
          _Var1 = ptrlen_eq_ptrlen(_auStack_98,*(ptrlen *)(*(long *)(i + 8) + local_88 * 0x28));
          if (_Var1) {
            load_error._7_1_ =
                 ((*(uint *)(*(long *)(i + 8) + local_88 * 0x28 + 0x20) & 2) != 0 ^ 0xffU) & 1;
            load_error._6_1_ = (*(uint *)(*(long *)(i + 8) + local_88 * 0x28 + 0x20) & 1) != 0;
            if (((load_error._7_1_ != 0) && ((rkey._7_1_ & 1) == 0)) ||
               (((bool)load_error._6_1_ && ((rkey._7_1_ & 1) != 0)))) {
              keylist_free((KeyList *)i);
              strbuf_free((strbuf *)kl);
              return 0;
            }
          }
        }
        keylist_free((KeyList *)i);
      }
      strbuf_free((strbuf *)kl);
      if ((rkey._7_1_ & 1) == 0) {
        pcStack_68 = (char *)0x0;
        if (blob._4_4_ == 2) {
          attempts._3_1_ = rsa1_encrypted_f((Filename *)passphrase_local,&this_passphrase);
        }
        else {
          attempts._3_1_ = ppk_encrypted_f((Filename *)passphrase_local,&this_passphrase);
        }
        comment._4_4_ = 0;
        if (blob._4_4_ == 2) {
          skey = (ssh2_userkey *)safemalloc(1,0x48,0);
        }
        while( true ) {
          if ((attempts._3_1_ & 1) == 0) {
            error = "";
          }
          else {
            if (retstr_local == (char **)0x0) {
              error = (char *)index234(passphrases,comment._4_4_);
            }
            else {
              if (comment._4_4_ == 0) {
                local_f0 = retstr_local;
              }
              else {
                local_f0 = (char **)0x0;
              }
              error = (char *)local_f0;
            }
            if (error == (char *)0x0) {
              *ppcStack_28 = this_passphrase;
              safefree(skey);
              return 2;
            }
          }
          if (blob._4_4_ == 2) {
            local_48 = rsa1_load_f((Filename *)passphrase_local,(RSAKey *)skey,error,
                                   &stack0xffffffffffffff98);
          }
          else {
            _ret = ppk_load_f((Filename *)passphrase_local,error,&stack0xffffffffffffff98);
            if (_ret == &ssh2_wrong_passphrase) {
              local_48 = 0xffffffff;
            }
            else {
              local_48 = (uint)(_ret != (ssh2_userkey *)0x0);
            }
          }
          if (local_48 == 0) {
            pcVar4 = dupstr(pcStack_68);
            *ppcStack_28 = pcVar4;
            safefree(skey);
            if (this_passphrase != (char *)0x0) {
              safefree(this_passphrase);
            }
            return 1;
          }
          if (local_48 == 1) break;
          comment._4_4_ = comment._4_4_ + 1;
        }
        pcVar4 = dupstr(error);
        pcVar6 = (char *)addpos234(passphrases,pcVar4,0);
        if (pcVar6 != pcVar4) {
          n = strlen(pcVar4);
          smemclr(pcVar4,n);
          safefree(pcVar4);
        }
        if (this_passphrase != (char *)0x0) {
          safefree(this_passphrase);
        }
        if (blob._4_4_ == 2) {
          pPVar5 = pageant_client_op_new();
          BinarySink_put_byte(pPVar5->binarysink_,'\a');
          rsa_ssh1_private_blob_agent(pPVar5->binarysink_,(RSAKey *)skey);
          BinarySink_put_stringz(pPVar5->binarysink_,skey[3].comment);
          uVar3 = pageant_client_op_query(pPVar5);
          pageant_client_op_free(pPVar5);
          freersakey((RSAKey *)skey);
          safefree(skey);
          if (uVar3 != 6) {
            pcVar4 = dupstr("The already running agent refused to add the key.");
            *ppcStack_28 = pcVar4;
            return 1;
          }
        }
        else {
          pPVar5 = pageant_client_op_new();
          BinarySink_put_byte(pPVar5->binarysink_,'\x11');
          bs = pPVar5->binarysink_;
          pcVar4 = ssh_key_ssh_id(_ret->key);
          BinarySink_put_stringz(bs,pcVar4);
          ssh_key_openssh_blob(_ret->key,pPVar5->binarysink_);
          BinarySink_put_stringz(pPVar5->binarysink_,_ret->comment);
          uVar3 = pageant_client_op_query(pPVar5);
          pageant_client_op_free(pPVar5);
          safefree(_ret->comment);
          ssh_key_free(_ret->key);
          safefree(_ret);
          if (uVar3 != 6) {
            pcVar4 = dupstr("The already running agent refused to add the key.");
            *ppcStack_28 = pcVar4;
            return 1;
          }
        }
        filename_local._4_4_ = 0;
      }
      else {
        lf_00 = lf_load_keyfile((Filename *)passphrase_local,(char **)&lf);
        if (lf_00 == (LoadedFile *)0x0) {
          pcVar4 = dupstr((char *)lf);
          *ppcStack_28 = pcVar4;
          filename_local._4_4_ = 1;
        }
        else {
          pPVar5 = pageant_client_op_new();
          BinarySink_put_byte(pPVar5->binarysink_,'\x1b');
          pl.len = 0x23;
          pl.ptr = "add-ppk@putty.projects.tartarus.org";
          BinarySink_put_stringpl(pPVar5->binarysink_,pl);
          BinarySink_put_string(pPVar5->binarysink_,lf_00->data,lf_00->len);
          lf_free(lf_00);
          uVar3 = pageant_client_op_query(pPVar5);
          pageant_client_op_free(pPVar5);
          if (uVar3 == 6) {
            filename_local._4_4_ = 0;
          }
          else {
            if (uVar3 == 5) {
              pcVar4 = dupstr("Agent doesn\'t support adding encrypted keys");
              *ppcStack_28 = pcVar4;
            }
            else {
              pcVar4 = dupstr("The already running agent refused to add the key.");
              *ppcStack_28 = pcVar4;
            }
            filename_local._4_4_ = 1;
          }
        }
      }
    }
    else {
      pcVar4 = dupprintf("Can\'t add SSH-1 keys in encrypted form");
      *ppcStack_28 = pcVar4;
      filename_local._4_4_ = 1;
    }
  }
  else {
    pcVar4 = key_type_to_str(blob._4_4_);
    pcVar4 = dupprintf("Couldn\'t load this key (%s)",pcVar4);
    *ppcStack_28 = pcVar4;
    filename_local._4_4_ = 1;
  }
  return filename_local._4_4_;
}

Assistant:

int pageant_add_keyfile(Filename *filename, const char *passphrase,
                        char **retstr, bool add_encrypted)
{
    RSAKey *rkey = NULL;
    ssh2_userkey *skey = NULL;
    bool needs_pass;
    int ret;
    int attempts;
    char *comment;
    const char *this_passphrase;
    const char *error = NULL;
    int type;

    if (!passphrases) {
        passphrases = newtree234(NULL);
    }

    *retstr = NULL;

    type = key_type(filename);
    if (type != SSH_KEYTYPE_SSH1 && type != SSH_KEYTYPE_SSH2) {
        *retstr = dupprintf("Couldn't load this key (%s)",
                            key_type_to_str(type));
        return PAGEANT_ACTION_FAILURE;
    }

    if (add_encrypted && type == SSH_KEYTYPE_SSH1) {
        *retstr = dupprintf("Can't add SSH-1 keys in encrypted form");
        return PAGEANT_ACTION_FAILURE;
    }

    /*
     * See if the key is already loaded (in the primary Pageant,
     * which may or may not be us).
     */
    {
        strbuf *blob = strbuf_new();
        KeyList *kl;

        if (type == SSH_KEYTYPE_SSH1) {
            if (!rsa1_loadpub_f(filename, BinarySink_UPCAST(blob),
                                NULL, &error)) {
                *retstr = dupprintf("Couldn't load private key (%s)", error);
                strbuf_free(blob);
                return PAGEANT_ACTION_FAILURE;
            }
            kl = pageant_get_keylist(1);
        } else {
            if (!ppk_loadpub_f(filename, NULL, BinarySink_UPCAST(blob),
                               NULL, &error)) {
                *retstr = dupprintf("Couldn't load private key (%s)", error);
                strbuf_free(blob);
                return PAGEANT_ACTION_FAILURE;
            }
            kl = pageant_get_keylist(2);
        }

        if (kl) {
            if (kl->broken) {
                *retstr = dupstr("Received broken key list from agent");
                keylist_free(kl);
                strbuf_free(blob);
                return PAGEANT_ACTION_FAILURE;
            }

            for (size_t i = 0; i < kl->nkeys; i++) {
                /*
                 * If the key already exists in the agent, we're done,
                 * except in the following special cases:
                 *
                 * It's encrypted in the agent, and we're being asked
                 * to add it unencrypted, in which case we still want
                 * to upload the unencrypted version to cause the key
                 * to become decrypted.
                 * (Rationale: if you know in advance you're going to
                 * want it, and don't want to be interrupted at an
                 * unpredictable moment to be asked for the
                 * passphrase.)
                 *
                 * The agent only has cleartext, and we're being asked
                 * to add it encrypted, in which case we'll add the
                 * encrypted form.
                 * (Rationale: if you might want to re-encrypt the key
                 * at some future point, but it happened to have been
                 * initially added in cleartext, perhaps by something
                 * other than Pageant.)
                 */
                if (ptrlen_eq_ptrlen(ptrlen_from_strbuf(blob),
                                     kl->keys[i].blob)) {
                    bool have_unencrypted =
                        !(kl->keys[i].flags &
                          LIST_EXTENDED_FLAG_HAS_NO_CLEARTEXT_KEY);
                    bool have_encrypted =
                        (kl->keys[i].flags &
                         LIST_EXTENDED_FLAG_HAS_ENCRYPTED_KEY_FILE);
                    if ((have_unencrypted && !add_encrypted)
                        || (have_encrypted && add_encrypted)) {
                        /* Key is already present in the desired form;
                         * we can now leave. */
                        keylist_free(kl);
                        strbuf_free(blob);
                        return PAGEANT_ACTION_OK;
                    }
                }
            }

            keylist_free(kl);
        }

        strbuf_free(blob);
    }

    if (add_encrypted) {
        const char *load_error;
        LoadedFile *lf = lf_load_keyfile(filename, &load_error);
        if (!lf) {
            *retstr = dupstr(load_error);
            return PAGEANT_ACTION_FAILURE;
        }

        PageantClientOp *pco = pageant_client_op_new();
        put_byte(pco, SSH2_AGENTC_EXTENSION);
        put_stringpl(pco, extension_names[EXT_ADD_PPK]);
        put_string(pco, lf->data, lf->len);

        lf_free(lf);

        unsigned reply = pageant_client_op_query(pco);
        pageant_client_op_free(pco);

        if (reply != SSH_AGENT_SUCCESS) {
            if (reply == SSH_AGENT_FAILURE) {
                /* The agent didn't understand the protocol extension
                 * at all. */
                *retstr = dupstr("Agent doesn't support adding "
                                 "encrypted keys");
            } else {
                *retstr = dupstr("The already running agent "
                                 "refused to add the key.");
            }
            return PAGEANT_ACTION_FAILURE;
        }

        return PAGEANT_ACTION_OK;
    }

    error = NULL;
    if (type == SSH_KEYTYPE_SSH1)
        needs_pass = rsa1_encrypted_f(filename, &comment);
    else
        needs_pass = ppk_encrypted_f(filename, &comment);
    attempts = 0;
    if (type == SSH_KEYTYPE_SSH1)
        rkey = snew(RSAKey);

    /*
     * Loop round repeatedly trying to load the key, until we either
     * succeed, fail for some serious reason, or run out of
     * passphrases to try.
     */
    while (1) {
        if (needs_pass) {

            /*
             * If we've been given a passphrase on input, try using
             * it. Otherwise, try one from our tree234 of previously
             * useful passphrases.
             */
            if (passphrase) {
                this_passphrase = (attempts == 0 ? passphrase : NULL);
            } else {
                this_passphrase = (const char *)index234(passphrases, attempts);
            }

            if (!this_passphrase) {
                /*
                 * Run out of passphrases to try.
                 */
                *retstr = comment;
                sfree(rkey);
                return PAGEANT_ACTION_NEED_PP;
            }
        } else
            this_passphrase = "";

        if (type == SSH_KEYTYPE_SSH1)
            ret = rsa1_load_f(filename, rkey, this_passphrase, &error);
        else {
            skey = ppk_load_f(filename, this_passphrase, &error);
            if (skey == SSH2_WRONG_PASSPHRASE)
                ret = -1;
            else if (!skey)
                ret = 0;
            else
                ret = 1;
        }

        if (ret == 0) {
            /*
             * Failed to load the key file, for some reason other than
             * a bad passphrase.
             */
            *retstr = dupstr(error);
            sfree(rkey);
            if (comment)
                sfree(comment);
            return PAGEANT_ACTION_FAILURE;
        } else if (ret == 1) {
            /*
             * Successfully loaded the key file.
             */
            break;
        } else {
            /*
             * Passphrase wasn't right; go round again.
             */
            attempts++;
        }
    }

    /*
     * If we get here, we've successfully loaded the key into
     * rkey/skey, but not yet added it to the agent.
     */

    /*
     * If the key was successfully decrypted, save the passphrase for
     * use with other keys we try to load.
     */
    {
        char *pp_copy = dupstr(this_passphrase);
        if (addpos234(passphrases, pp_copy, 0) != pp_copy) {
            /* No need; it was already there. */
            smemclr(pp_copy, strlen(pp_copy));
            sfree(pp_copy);
        }
    }

    if (comment)
        sfree(comment);

    if (type == SSH_KEYTYPE_SSH1) {
        PageantClientOp *pco = pageant_client_op_new();
        put_byte(pco, SSH1_AGENTC_ADD_RSA_IDENTITY);
        rsa_ssh1_private_blob_agent(BinarySink_UPCAST(pco), rkey);
        put_stringz(pco, rkey->comment);
        unsigned reply = pageant_client_op_query(pco);
        pageant_client_op_free(pco);

        freersakey(rkey);
        sfree(rkey);

        if (reply != SSH_AGENT_SUCCESS) {
            *retstr = dupstr("The already running agent "
                             "refused to add the key.");
            return PAGEANT_ACTION_FAILURE;
        }
    } else {
        PageantClientOp *pco = pageant_client_op_new();
        put_byte(pco, SSH2_AGENTC_ADD_IDENTITY);
        put_stringz(pco, ssh_key_ssh_id(skey->key));
        ssh_key_openssh_blob(skey->key, BinarySink_UPCAST(pco));
        put_stringz(pco, skey->comment);
        unsigned reply = pageant_client_op_query(pco);
        pageant_client_op_free(pco);

        sfree(skey->comment);
        ssh_key_free(skey->key);
        sfree(skey);

        if (reply != SSH_AGENT_SUCCESS) {
            *retstr = dupstr("The already running agent "
                             "refused to add the key.");
            return PAGEANT_ACTION_FAILURE;
        }
    }
    return PAGEANT_ACTION_OK;
}